

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O2

SceneLoader * __thiscall
COLLADASaxFWL::RootParser15::beginCommon<COLLADASaxFWL::SceneLoader,COLLADASaxFWL::SceneLoader15>
          (RootParser15 *this)

{
  FileLoader *pFVar1;
  SceneLoader *this_00;
  SceneLoader15 *this_01;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)this->mFileLoader);
  this_00 = (SceneLoader *)operator_new(0x90);
  SceneLoader::SceneLoader(this_00,(IFilePartLoader *)this->mFileLoader);
  this_01 = (SceneLoader15 *)operator_new(0x20);
  SceneLoader15::SceneLoader15(this_01,this_00);
  (this_00->super_FilePartLoader).super_IFilePartLoader.mParserImpl = (IParserImpl *)this_01;
  pFVar1 = this->mFileLoader;
  (pFVar1->super_DocumentProcessor).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  (*(pFVar1->super_DocumentProcessor).super_IFilePartLoader.super_ExtraDataLoader.
    _vptr_ExtraDataLoader[10])(pFVar1,&(this_01->super_IParserImpl15).super_ColladaParserAutoGen15);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommon( )
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		return loader;
	}